

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_light.cpp
# Opt level: O0

bool __thiscall ON_Light::Transform(ON_Light *this,ON_Xform *xform)

{
  double dVar1;
  ON_3dVector local_98;
  ON_3dVector local_80;
  ON_3dVector local_68;
  ON_3dPoint local_50;
  double local_38;
  double vlen;
  ON_3dVector v;
  ON_Xform *xform_local;
  ON_Light *this_local;
  
  v.z = (double)xform;
  ON_Object::TransformUserData((ON_Object *)this,xform);
  ON_Xform::operator*(&local_50,(ON_Xform *)v.z,&this->m_location);
  (this->m_location).x = local_50.x;
  (this->m_location).y = local_50.y;
  (this->m_location).z = local_50.z;
  ON_Xform::operator*(&local_68,(ON_Xform *)v.z,&this->m_direction);
  vlen = local_68.x;
  v.x = local_68.y;
  v.y = local_68.z;
  local_38 = ON_3dVector::Length((ON_3dVector *)&vlen);
  if (0.0 < local_38) {
    (this->m_direction).x = vlen;
    (this->m_direction).y = v.x;
    (this->m_direction).z = v.y;
  }
  ON_Xform::operator*(&local_80,(ON_Xform *)v.z,&this->m_length);
  vlen = local_80.x;
  v.x = local_80.y;
  v.y = local_80.z;
  local_38 = ON_3dVector::Length((ON_3dVector *)&vlen);
  if (0.0 < local_38) {
    (this->m_length).x = vlen;
    (this->m_length).y = v.x;
    (this->m_length).z = v.y;
  }
  ON_Xform::operator*(&local_98,(ON_Xform *)v.z,&this->m_width);
  vlen = local_98.x;
  v.x = local_98.y;
  v.y = local_98.z;
  dVar1 = ON_3dVector::Length((ON_3dVector *)&vlen);
  if (0.0 < dVar1) {
    (this->m_width).x = vlen;
    (this->m_width).y = v.x;
    (this->m_width).z = v.y;
  }
  return true;
}

Assistant:

bool ON_Light::Transform( 
       const ON_Xform& xform
       )
{
  ON_3dVector v;
  double vlen;
  TransformUserData(xform);
  m_location = xform*m_location;
  
  v = xform*m_direction;
  vlen = v.Length();
  if ( vlen > 0.0 ) {
    m_direction = v;
  }
  
  v = xform*m_length;
  vlen = v.Length();
  if ( vlen > 0.0 ) {
    m_length = v;
  }
  
  v = xform*m_width;
  vlen = v.Length();
  if ( vlen > 0.0 ) {
    m_width = v;
  }
  return true;
}